

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEPlanet.cpp
# Opt level: O0

bool __thiscall test_CEPlanet::test_Planets(test_CEPlanet *this)

{
  byte bVar1;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x88))();
  (**(code **)(*in_RDI + 0x90))();
  (**(code **)(*in_RDI + 0x98))();
  (**(code **)(*in_RDI + 0xa0))();
  (**(code **)(*in_RDI + 0xa8))();
  (**(code **)(*in_RDI + 0xb0))();
  (**(code **)(*in_RDI + 0xb8))();
  (**(code **)(*in_RDI + 0xc0))();
  bVar1 = (**(code **)(*in_RDI + 0x18))();
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CEPlanet::test_Planets(void)
{
    test_mercury();
    test_venus();
    test_earth();
    test_mars();
    test_jupiter();
    test_saturn();
    test_uranus();
    test_neptune();

    return pass();
}